

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.c
# Opt level: O2

void rational_subtract(rational_t *n1,rational_t *n2,rational_t *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  long lVar5;
  
  bVar4 = 1;
  if (n1->valid == true) {
    bVar4 = n2->valid ^ 1;
  }
  lVar1 = n2->den;
  lVar3 = n1->num * lVar1;
  lVar2 = n1->den;
  lVar5 = n2->num * lVar2;
  rational_internal_init
            (result,lVar3 - lVar5,lVar2 * lVar1,
             (_Bool)(~(SEXT816(lVar3) != SEXT816(n1->num) * SEXT816(lVar1) | bVar4 |
                       SEXT816(lVar5) != SEXT816(n2->num) * SEXT816(lVar2) |
                       SEXT816(lVar2 * lVar1) != SEXT816(lVar2) * SEXT816(lVar1) |
                      SBORROW8(lVar3,lVar5)) & 1));
  return;
}

Assistant:

void rational_subtract(rational_t *n1,
                       rational_t *n2,
                       rational_t *result)
{
    long num1_den2_product, den1_num2_product, den1_x_den2, diff;
    bool v0 = n1->valid && n2->valid;
    bool v1 = long_multiply(n1->num, n2->den, &num1_den2_product);
    bool v2 = long_multiply(n2->num, n1->den, &den1_num2_product);
    bool v3 = long_multiply(n1->den, n2->den, &den1_x_den2);
    bool v4 = long_subtract(num1_den2_product, den1_num2_product, &diff);
    bool valid = v0 && v1 && v2 && v3 && v4;
    rational_internal_init(result, diff, den1_x_den2, valid);
}